

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
SmallArray<ExpressionEvalContext::StackVariable,_32U>::grow
          (SmallArray<ExpressionEvalContext::StackVariable,_32U> *this,uint newSize)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  StackVariable *pSVar3;
  uint count;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  StackVariable *__s;
  long lVar7;
  uint i;
  uint uVar8;
  ulong uVar9;
  
  uVar8 = (this->max >> 1) + this->max;
  count = newSize + 4;
  if (newSize < uVar8) {
    count = uVar8;
  }
  if (this->allocator == (Allocator *)0x0) {
    __s = (StackVariable *)(*(code *)NULLC::alloc)(count << 4 | 4);
    if (count != 0) {
      memset(__s,0,(long)(int)count << 4);
    }
  }
  else {
    __s = Allocator::construct<ExpressionEvalContext::StackVariable>(this->allocator,count);
  }
  lVar7 = 0;
  uVar9 = 0;
  while( true ) {
    pSVar3 = this->data;
    if (this->count <= uVar9) break;
    puVar1 = (undefined4 *)((long)&pSVar3->variable + lVar7);
    uVar4 = puVar1[1];
    uVar5 = puVar1[2];
    uVar6 = puVar1[3];
    puVar2 = (undefined4 *)((long)&__s->variable + lVar7);
    *puVar2 = *puVar1;
    puVar2[1] = uVar4;
    puVar2[2] = uVar5;
    puVar2[3] = uVar6;
    uVar9 = uVar9 + 1;
    lVar7 = lVar7 + 0x10;
  }
  if (pSVar3 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (pSVar3 != (StackVariable *)0x0) {
        (*(code *)NULLC::dealloc)(pSVar3);
      }
    }
    else if (pSVar3 != (StackVariable *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  this->data = __s;
  this->max = count;
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 4;

		T* newData = 0;
		
		if(allocator)
			newData = allocator->construct<T>(newSize);
		else
			newData = NULLC::construct<T>(newSize);

		for(unsigned i = 0; i < count; i++)
			newData[i] = data[i];

		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}

		data = newData;

		max = newSize;
	}